

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Fts3HashInsert(Fts3Hash *pH,void *pKey,int nKey,void *data)

{
  uint uVar1;
  uint h_00;
  int iVar2;
  _func_int_void_ptr_int *p_Var3;
  Fts3HashElem *pFVar4;
  void *pvVar5;
  void *old_data;
  _func_int_void_ptr_int *xHash;
  Fts3HashElem *new_elem;
  Fts3HashElem *elem;
  int h;
  int hraw;
  void *data_local;
  int nKey_local;
  void *pKey_local;
  Fts3Hash *pH_local;
  
  p_Var3 = ftsHashFunction((int)pH->keyClass);
  uVar1 = (*p_Var3)(pKey,nKey);
  h_00 = uVar1 & pH->htsize - 1U;
  pFVar4 = fts3FindElementByHash(pH,pKey,nKey,h_00);
  if (pFVar4 == (Fts3HashElem *)0x0) {
    if (data == (void *)0x0) {
      pH_local = (Fts3Hash *)0x0;
    }
    else {
      pH_local = (Fts3Hash *)data;
      if (((pH->htsize == 0) && (iVar2 = fts3Rehash(pH,8), iVar2 != 0)) ||
         ((pH->htsize <= pH->count && (iVar2 = fts3Rehash(pH,pH->htsize << 1), iVar2 != 0)))) {
        pH->count = 0;
      }
      else {
        pFVar4 = (Fts3HashElem *)fts3HashMalloc(0x28);
        if (pFVar4 != (Fts3HashElem *)0x0) {
          if ((pH->copyKey == '\0') || (pKey == (void *)0x0)) {
            pFVar4->pKey = pKey;
          }
          else {
            pvVar5 = fts3HashMalloc((long)nKey);
            pFVar4->pKey = pvVar5;
            if (pFVar4->pKey == (void *)0x0) {
              fts3HashFree(pFVar4);
              return data;
            }
            memcpy(pFVar4->pKey,pKey,(long)nKey);
          }
          pFVar4->nKey = nKey;
          pH->count = pH->count + 1;
          fts3HashInsertElement(pH,pH->ht + (int)(uVar1 & pH->htsize - 1U),pFVar4);
          pFVar4->data = data;
          pH_local = (Fts3Hash *)0x0;
        }
      }
    }
  }
  else {
    pH_local = (Fts3Hash *)pFVar4->data;
    if (data == (void *)0x0) {
      fts3RemoveElementByHash(pH,pFVar4,h_00);
    }
    else {
      pFVar4->data = data;
    }
  }
  return pH_local;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Fts3HashInsert(
  Fts3Hash *pH,        /* The hash table to insert into */
  const void *pKey,    /* The key */
  int nKey,            /* Number of bytes in the key */
  void *data           /* The data */
){
  int hraw;                 /* Raw hash value of the key */
  int h;                    /* the hash of the key modulo hash table size */
  Fts3HashElem *elem;       /* Used to loop thru the element list */
  Fts3HashElem *new_elem;   /* New element added to the pH */
  int (*xHash)(const void*,int);  /* The hash function */

  assert( pH!=0 );
  xHash = ftsHashFunction(pH->keyClass);
  assert( xHash!=0 );
  hraw = (*xHash)(pKey, nKey);
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  elem = fts3FindElementByHash(pH,pKey,nKey,h);
  if( elem ){
    void *old_data = elem->data;
    if( data==0 ){
      fts3RemoveElementByHash(pH,elem,h);
    }else{
      elem->data = data;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  if( (pH->htsize==0 && fts3Rehash(pH,8))
   || (pH->count>=pH->htsize && fts3Rehash(pH, pH->htsize*2))
  ){
    pH->count = 0;
    return data;
  }
  assert( pH->htsize>0 );
  new_elem = (Fts3HashElem*)fts3HashMalloc( sizeof(Fts3HashElem) );
  if( new_elem==0 ) return data;
  if( pH->copyKey && pKey!=0 ){
    new_elem->pKey = fts3HashMalloc( nKey );
    if( new_elem->pKey==0 ){
      fts3HashFree(new_elem);
      return data;
    }
    memcpy((void*)new_elem->pKey, pKey, nKey);
  }else{
    new_elem->pKey = (void*)pKey;
  }
  new_elem->nKey = nKey;
  pH->count++;
  assert( pH->htsize>0 );
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  fts3HashInsertElement(pH, &pH->ht[h], new_elem);
  new_elem->data = data;
  return 0;
}